

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

void __thiscall w3Module::read_types(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  uint32_t uVar2;
  reference functionType;
  allocator<char> local_51;
  string local_50;
  uint local_2c;
  ulong uStack_28;
  uint32_t marker;
  size_t i;
  size_t size;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  size = (size_t)cursor;
  cursor_local = (uint8_t **)this;
  printf("read_types1 offset:%lX\n",(long)*cursor - (long)this->base);
  uVar2 = read_varuint32(this,(uint8_t **)size);
  i = (size_t)uVar2;
  std::vector<w3FunctionType,_std::allocator<w3FunctionType>_>::resize(&this->function_types,i);
  for (uStack_28 = 0; uStack_28 < i; uStack_28 = uStack_28 + 1) {
    printf("read_types2 before marker offset:%lX\n",*(long *)size - (long)this->base);
    bVar1 = read_byte(this,(uint8_t **)size);
    local_2c = (uint)bVar1;
    printf("read_types3 marker:%X offset:%lX\n",(ulong)local_2c,*(long *)size - (long)this->base);
    if (local_2c != 0x60) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"malformed2 in Types::read",&local_51);
      ThrowString(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
    }
    functionType = std::vector<w3FunctionType,_std::allocator<w3FunctionType>_>::operator[]
                             (&this->function_types,uStack_28);
    read_function_type(this,functionType,(uint8_t **)size);
  }
  printf("read section 1\n");
  return;
}

Assistant:

void w3Module::read_types (uint8_t** cursor)
{
    printf ("read_types1 offset:%" FORMAT_SIZE "X\n", (long_t)(*cursor - this->base));
    const size_t size = read_varuint32 (cursor);
    function_types.resize (size);
    for (size_t i = 0; i < size; ++i)
    {
        printf ("read_types2 before marker offset:%" FORMAT_SIZE "X\n", (long_t)(*cursor - this->base));
        const uint32_t marker = read_byte (cursor);
        printf ("read_types3 marker:%X offset:%" FORMAT_SIZE "X\n", marker, (long_t)(*cursor - this->base));
        if (marker != 0x60)
            ThrowString ("malformed2 in Types::read");
        read_function_type (function_types [i], cursor);
    }
    printf ("read section 1\n");
}